

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ICUTransService.cpp
# Opt level: O3

bool __thiscall xercesc_4_0::ICUTranscoder::canTranscodeTo(ICUTranscoder *this,uint toCheck)

{
  uint uVar1;
  void **ppvVar2;
  bool bVar3;
  UChar local_ac;
  ushort local_aa;
  void *orgContent;
  UErrorCode err;
  UConverterFromUCallback orgAction;
  UChar *startSrc;
  char *startTarget;
  UConverterFromUCallback oldCB;
  char tmpBuf [64];
  undefined1 local_38 [8];
  
  if (toCheck < 0x10000) {
    ppvVar2 = (void **)&local_aa;
    uVar1 = toCheck;
  }
  else {
    ppvVar2 = &orgContent;
    uVar1 = (toCheck >> 10) - 0x2800;
    local_aa = (ushort)toCheck & 0x3ff | 0xdc00;
  }
  local_ac = (UChar)uVar1;
  err = U_ZERO_ERROR;
  oldCB = (UConverterFromUCallback)0x0;
  ucnv_setFromUCallBack_70(this->fConverter,UCNV_FROM_U_CALLBACK_STOP_70,0,&oldCB,&orgContent,&err);
  startTarget = tmpBuf;
  err = U_ZERO_ERROR;
  startSrc = &local_ac;
  ucnv_fromUnicode_70(this->fConverter,&startTarget,local_38,&startSrc,ppvVar2,0,0,&err);
  bVar3 = err == U_ZERO_ERROR;
  err = U_ZERO_ERROR;
  orgAction = (UConverterFromUCallback)0x0;
  ucnv_setFromUCallBack_70(this->fConverter,oldCB,0,&orgAction,&orgContent,&err);
  return bVar3;
}

Assistant:

bool ICUTranscoder::canTranscodeTo(const unsigned int toCheck)
{
    //
    //  If the passed value is really a surrogate embedded together, then
    //  we need to break it out into its two chars. Else just one. While
    //  we are ate it, convert them to UChar format if required.
    //
    UChar           srcBuf[2];
    unsigned int    srcCount = 1;
    if (toCheck & 0xFFFF0000)
    {
        srcBuf[0] = UChar((toCheck >> 10) + 0xD800);
        srcBuf[1] = UChar(toCheck & 0x3FF) + 0xDC00;
        srcCount++;
    }
    else
    {
        srcBuf[0] = UChar(toCheck);
    }

    //
    //  Set the callback so that it will fail instead of using the rep char.
    //  Remember the old one so we can put it back.
    //
     UErrorCode  err = U_ZERO_ERROR;
     UConverterFromUCallback oldCB = NULL;
     #if (U_ICU_VERSION_MAJOR_NUM < 2)
     void* orgContent;
     #else
     const void* orgContent;
     #endif

     ucnv_setFromUCallBack
         (
         fConverter
         , UCNV_FROM_U_CALLBACK_STOP
         , NULL
         , &oldCB
         , &orgContent
         , &err
         );

    // Set up a temp buffer to format into. Make it more than big enough
    char            tmpBuf[64];
    char*           startTarget = tmpBuf;
    const UChar*    startSrc = srcBuf;

    err = U_ZERO_ERROR;
    ucnv_fromUnicode
    (
        fConverter
        , &startTarget
        , startTarget + 64
        , &startSrc
        , srcBuf + srcCount
        , 0
        , false
        , &err
    );

    // Save the result before we overight the error code
    const bool res = (err == U_ZERO_ERROR);

    // Put the old handler back
    err = U_ZERO_ERROR;
    UConverterFromUCallback orgAction = NULL;

    ucnv_setFromUCallBack(fConverter, oldCB, NULL, &orgAction, &orgContent, &err);

    return res;
}